

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O2

Name __thiscall
wasm::JSPI::makeWrapperForExport(JSPI *this,Function *func,Module *module,Name suspender)

{
  HeapType *this_00;
  ExpressionList *this_01;
  MixedArena *this_02;
  uintptr_t uVar1;
  string_view sVar2;
  char *pcVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  Module *this_03;
  undefined1 auVar5 [8];
  pointer pTVar6;
  Call *item;
  Type *__x;
  LocalGet *pLVar7;
  Block *this_04;
  GlobalSet *item_00;
  Function *pFVar8;
  Type TVar9;
  Type *__x_00;
  Index index;
  Signature SVar10;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar11;
  Name name;
  optional<wasm::Type> type_;
  Name name_00;
  Type local_150;
  string_view local_148;
  string_view local_138;
  HeapType local_128;
  Type local_120;
  size_t local_118;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_110;
  Module *local_108;
  Type *local_100;
  char *local_f8;
  size_t local_f0;
  string_view local_e8;
  undefined1 auStack_d8 [8];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedWrapperParams;
  undefined1 auStack_b8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> wrapperParams;
  undefined1 auStack_78 [8];
  Iterator __begin2;
  Builder local_50;
  Builder builder;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> wrapperFunc;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_d8,"export$",(allocator<char> *)&builder);
  IString::toString_abi_cxx11_((string *)auStack_78,(IString *)func);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78);
  local_f8 = suspender.super_IString.str._M_str;
  local_f0 = suspender.super_IString.str._M_len;
  IString::IString((IString *)&local_148,(string *)auStack_b8);
  local_e8 = (string_view)Names::getValidFunctionName(module,(Name)local_148);
  std::__cxx11::string::~string((string *)auStack_b8);
  std::__cxx11::string::~string((string *)auStack_78);
  std::__cxx11::string::~string((string *)auStack_d8);
  this_02 = &module->allocator;
  local_50.wasm = module;
  item = MixedArena::alloc<wasm::Call>(this_02);
  pcVar3 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  (item->target).super_IString.str._M_len =
       (func->super_Importable).super_Named.name.super_IString.str._M_len;
  (item->target).super_IString.str._M_str = pcVar3;
  this_00 = &func->type;
  SVar10 = HeapType::getSignature(this_00);
  (item->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
       SVar10.results.id.id;
  auStack_b8 = (undefined1  [8])0x0;
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x_00 = &this->externref;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_b8,__x_00);
  Name::Name((Name *)&local_138,"susp");
  _auStack_78 = (string_view)Names::getValidLocalName(func,(Name)local_138);
  std::vector<wasm::NameType,std::allocator<wasm::NameType>>::emplace_back<wasm::Name,wasm::Type&>
            ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_d8,(Name *)auStack_78,
             __x_00);
  SVar10 = HeapType::getSignature(this_00);
  local_150 = SVar10.params.id;
  auStack_78 = (undefined1  [8])&local_150;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  PVar11 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::end((Type *)auStack_78);
  local_110 = &(item->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  index = 0;
  local_108 = module;
  while( true ) {
    this_03 = local_108;
    PVar4.index = (size_t)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
    ;
    PVar4.parent = (Type *)auStack_78;
    local_118 = PVar11.index;
    local_100 = PVar11.parent;
    if (PVar11 == PVar4) break;
    __x = wasm::Type::Iterator::operator*((Iterator *)auStack_78);
    pTVar6 = wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar5 = auStack_b8;
    uVar1 = __x->id;
    pLVar7 = MixedArena::alloc<wasm::LocalGet>(this_02);
    pLVar7->index = (Index)((ulong)((long)pTVar6 - (long)auVar5) >> 3);
    (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_110,(Expression *)pLVar7);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_b8,__x);
    _builder = (string_view)Function::getLocalNameOrGeneric(func,index);
    std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
    emplace_back<wasm::Name,wasm::Type_const&>
              ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_d8,(Name *)&builder,
               __x);
    PVar11.index = local_118;
    PVar11.parent = local_100;
    index = index + 1;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)((long)&(__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                         )->id + 1);
  }
  this_04 = MixedArena::alloc<wasm::Block>(this_02);
  uVar1 = __x_00->id;
  pLVar7 = MixedArena::alloc<wasm::LocalGet>(&(local_50.wasm)->allocator);
  pLVar7->index = 0;
  (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
  name.super_IString.str._M_str = local_f8;
  name.super_IString.str._M_len = local_f0;
  item_00 = Builder::makeGlobalSet(&local_50,name,(Expression *)pLVar7);
  this_01 = &this_04->list;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item_00);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  SVar10 = HeapType::getSignature(this_00);
  TVar9 = SVar10.results.id;
  if (TVar9.id == 0) {
    item = (Call *)Builder::makeConst<int>(&local_50,0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    TVar9.id = 2;
  }
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)item;
  Block::finalize(this_04,type_,Unknown);
  wasm::Type::Type(&local_120,(Tuple *)auStack_b8);
  SVar10.results.id = TVar9.id;
  SVar10.params.id = local_120.id;
  HeapType::HeapType(&local_128,SVar10);
  _auStack_78 = (string_view)ZEXT816(0);
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  name_00.super_IString.str._M_str = (char *)local_e8._M_len;
  name_00.super_IString.str._M_len = (size_t)&builder;
  Builder::makeFunction
            (name_00,(vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_e8._M_str,
             (HeapType)auStack_d8,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_128.id,
             (Expression *)auStack_78);
  std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
            ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_78);
  pFVar8 = Module::addFunction(this_03,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                        *)&builder);
  sVar2 = (pFVar8->super_Importable).super_Named.name.super_IString.str;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&builder);
  std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
            ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_d8);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_b8);
  return (IString)(IString)sVar2;
}

Assistant:

Name makeWrapperForExport(Function* func, Module* module, Name suspender) {
    Name wrapperName = Names::getValidFunctionName(
      *module, std::string("export$") + func->name.toString());

    Builder builder(*module);

    auto* call = module->allocator.alloc<Call>();
    call->target = func->name;
    call->type = func->getResults();

    // Add an externref param as the first argument and copy all the original
    // params to new export.
    std::vector<Type> wrapperParams;
    std::vector<NameType> namedWrapperParams;
    wrapperParams.push_back(externref);
    namedWrapperParams.emplace_back(Names::getValidLocalName(*func, "susp"),
                                    externref);
    Index i = 0;
    for (const auto& param : func->getParams()) {
      call->operands.push_back(
        builder.makeLocalGet(wrapperParams.size(), param));
      wrapperParams.push_back(param);
      namedWrapperParams.emplace_back(func->getLocalNameOrGeneric(i), param);
      i++;
    }
    auto* block = builder.makeBlock();
    block->list.push_back(
      builder.makeGlobalSet(suspender, builder.makeLocalGet(0, externref)));
    block->list.push_back(call);
    Type resultsType = func->getResults();
    if (resultsType == Type::none) {
      // A void return is not currently allowed by v8. Add an i32 return value
      // that is ignored.
      // https://bugs.chromium.org/p/v8/issues/detail?id=13231
      resultsType = Type::i32;
      block->list.push_back(builder.makeConst(0));
    }
    block->finalize();
    auto wrapperFunc =
      Builder::makeFunction(wrapperName,
                            std::move(namedWrapperParams),
                            Signature(Type(wrapperParams), resultsType),
                            {},
                            block);
    return module->addFunction(std::move(wrapperFunc))->name;
  }